

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
::fulfill(AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
          *this,Client *value)

{
  ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client> EStack_1c8;
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::ExceptionOr(&EStack_1c8,value);
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::operator=
              (&this->result,&EStack_1c8);
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::~ExceptionOr(&EStack_1c8);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }